

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dleq_impl.h
# Opt level: O0

int secp256k1_dleq_prove
              (secp256k1_context *ctx,secp256k1_scalar *s,secp256k1_scalar *e,secp256k1_scalar *sk,
              secp256k1_ge *gen2,secp256k1_ge *p1,secp256k1_ge *p2,
              secp256k1_nonce_function_hardened_ecdsa_adaptor noncefp,void *ndata)

{
  int iVar1;
  uint uVar2;
  secp256k1_scalar *in_RCX;
  secp256k1_context *in_RDI;
  size_t pubkey_size;
  int ret;
  uchar p2_33 [33];
  uchar p1_33 [33];
  uchar gen2_33 [33];
  uchar sk32 [32];
  secp256k1_scalar k;
  secp256k1_ge r2;
  secp256k1_ge r1;
  size_t *in_stack_fffffffffffffe28;
  uchar *in_stack_fffffffffffffe30;
  secp256k1_ge *elem;
  secp256k1_scalar *in_stack_fffffffffffffe50;
  secp256k1_scalar *in_stack_fffffffffffffe58;
  secp256k1_scalar *in_stack_fffffffffffffe60;
  secp256k1_scalar *in_stack_fffffffffffffe68;
  secp256k1_scalar *in_stack_fffffffffffffe70;
  secp256k1_ge *in_stack_fffffffffffffeb8;
  secp256k1_ge *in_stack_fffffffffffffec0;
  secp256k1_ge *in_stack_fffffffffffffec8;
  secp256k1_ge *in_stack_fffffffffffffed0;
  secp256k1_ge *in_stack_fffffffffffffed8;
  secp256k1_scalar *in_stack_fffffffffffffee0;
  uchar *in_stack_fffffffffffffee8;
  uchar *in_stack_fffffffffffffef0;
  uchar *in_stack_fffffffffffffef8;
  uchar *in_stack_ffffffffffffff00;
  secp256k1_scalar *in_stack_ffffffffffffff08;
  undefined1 local_e8 [8];
  secp256k1_ge *in_stack_ffffffffffffff20;
  secp256k1_scalar *in_stack_ffffffffffffff28;
  secp256k1_ge *in_stack_ffffffffffffff30;
  secp256k1_ge *in_stack_ffffffffffffff38;
  secp256k1_ecmult_gen_context *in_stack_ffffffffffffff40;
  undefined1 local_90 [104];
  secp256k1_scalar *local_28;
  secp256k1_context *local_10;
  uint local_4;
  
  local_28 = in_RCX;
  local_10 = in_RDI;
  memset(&stack0xfffffffffffffef8,0,0x20);
  elem = (secp256k1_ge *)0x21;
  secp256k1_scalar_get_b32(&stack0xfffffffffffffed8,local_28);
  iVar1 = secp256k1_eckey_pubkey_serialize
                    (elem,in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,0);
  if (iVar1 == 0) {
    local_4 = 0;
  }
  else {
    iVar1 = secp256k1_eckey_pubkey_serialize
                      (elem,in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,0);
    if (iVar1 == 0) {
      local_4 = 0;
    }
    else {
      iVar1 = secp256k1_eckey_pubkey_serialize
                        (elem,in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,0);
      if (iVar1 == 0) {
        local_4 = 0;
      }
      else {
        uVar2 = secp256k1_dleq_nonce
                          (in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,
                           in_stack_fffffffffffffef8,in_stack_fffffffffffffef0,
                           in_stack_fffffffffffffee8,
                           (secp256k1_nonce_function_hardened_ecdsa_adaptor)
                           in_stack_fffffffffffffee0,in_stack_ffffffffffffff20);
        secp256k1_dleq_pair(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,
                            in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
                            in_stack_ffffffffffffff20);
        secp256k1_declassify(local_10,local_90,0x58);
        secp256k1_declassify(local_10,local_e8,0x58);
        secp256k1_dleq_challenge
                  (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,in_stack_fffffffffffffed0,
                   in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
        secp256k1_scalar_mul
                  (in_stack_fffffffffffffe70,in_stack_fffffffffffffe68,in_stack_fffffffffffffe60);
        secp256k1_scalar_add
                  (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,in_stack_fffffffffffffe50);
        secp256k1_scalar_clear((secp256k1_scalar *)&stack0xfffffffffffffef8);
        local_4 = uVar2 & 1;
      }
    }
  }
  return local_4;
}

Assistant:

static int secp256k1_dleq_prove(const secp256k1_context* ctx, secp256k1_scalar *s, secp256k1_scalar *e, const secp256k1_scalar *sk, secp256k1_ge *gen2, secp256k1_ge *p1, secp256k1_ge *p2, secp256k1_nonce_function_hardened_ecdsa_adaptor noncefp, void *ndata) {
    secp256k1_ge r1, r2;
    secp256k1_scalar k = { 0 };
    unsigned char sk32[32];
    unsigned char gen2_33[33];
    unsigned char p1_33[33];
    unsigned char p2_33[33];
    int ret = 1;
    size_t pubkey_size = 33;

    secp256k1_scalar_get_b32(sk32, sk);
    if (!secp256k1_eckey_pubkey_serialize(gen2, gen2_33, &pubkey_size, 1)) {
        return 0;
    }
    if (!secp256k1_eckey_pubkey_serialize(p1, p1_33, &pubkey_size, 1)) {
        return 0;
    }
    if (!secp256k1_eckey_pubkey_serialize(p2, p2_33, &pubkey_size, 1)) {
        return 0;
    }

    ret &= secp256k1_dleq_nonce(&k, sk32, gen2_33, p1_33, p2_33, noncefp, ndata);
    /* R1 = k*G, R2 = k*Y */
    secp256k1_dleq_pair(&ctx->ecmult_gen_ctx, &r1, &r2, &k, gen2);
    /* We declassify the non-secret values r1 and r2 to allow using them as
     * branch points. */
    secp256k1_declassify(ctx, &r1, sizeof(r1));
    secp256k1_declassify(ctx, &r2, sizeof(r2));

    /* e = tagged hash(p1, gen2, p2, r1, r2) */
    /* s = k + e * sk */
    secp256k1_dleq_challenge(e, gen2, &r1, &r2, p1, p2);
    secp256k1_scalar_mul(s, e, sk);
    secp256k1_scalar_add(s, s, &k);

    secp256k1_scalar_clear(&k);
    return ret;
}